

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O2

int lyv_multicases(lyd_node *node,lys_node *schemanode,lyd_node **first_sibling,int autodelete,
                  lyd_node *nodel)

{
  LYS_NODE LVar1;
  lyd_node *plVar2;
  int iVar3;
  lys_node *plVar4;
  lys_node *plVar5;
  lyd_node *node_00;
  lys_node *local_38;
  
  if (node == (lyd_node *)0x0 && schemanode == (lys_node *)0x0) {
    __assert_fail("node || schemanode",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/validation.c"
                  ,0x37d,
                  "int lyv_multicases(struct lyd_node *, struct lys_node *, struct lyd_node **, int, struct lyd_node *)"
                 );
  }
  if (schemanode == (lys_node *)0x0) {
    schemanode = node->schema;
  }
  local_38 = lys_parent(schemanode);
  while( true ) {
    if (local_38 == (lys_node *)0x0) {
      return 0;
    }
    LVar1 = local_38->nodetype;
    if (LVar1 != LYS_USES) break;
    local_38 = lys_parent(local_38);
  }
  if (first_sibling == (lyd_node **)0x0) {
    return 0;
  }
  if ((LVar1 & (LYS_CASE|LYS_CHOICE)) == LYS_UNKNOWN) {
    return 0;
  }
  if (*first_sibling == (lyd_node *)0x0) {
    return 0;
  }
  plVar5 = schemanode;
  if (LVar1 != LYS_CHOICE) goto LAB_0011f272;
  do {
    plVar2 = *first_sibling;
LAB_0011f285:
    node_00 = plVar2;
    if (node_00 != (lyd_node *)0x0) {
      plVar4 = node_00->schema;
      plVar2 = node_00->next;
      if (schemanode != plVar4) {
        do {
          plVar4 = lys_parent(plVar4);
          if (plVar4 == (lys_node *)0x0) goto LAB_0011f285;
          LVar1 = plVar4->nodetype;
        } while (LVar1 == LYS_USES);
        if (((LVar1 == LYS_CHOICE) && (plVar4 == local_38)) ||
           ((plVar4 != plVar5 && LVar1 == LYS_CASE &&
            (plVar4 = lys_parent(plVar4), plVar4 == local_38)))) {
          if (autodelete == 0) {
            iVar3 = 1;
          }
          else {
            if (node_00 != nodel) {
              if (node_00 == *first_sibling) {
                *first_sibling = plVar2;
              }
              lyd_free(node_00);
              goto LAB_0011f285;
            }
            iVar3 = 2;
          }
          ly_vlog(schemanode->module->ctx,LYE_MCASEDATA,LY_VLOG_LYD,node_00,local_38->name);
          return iVar3;
        }
      }
      goto LAB_0011f285;
    }
    if (*first_sibling == (lyd_node *)0x0) {
      return 0;
    }
    local_38 = lys_parent(local_38);
    if (local_38 == (lys_node *)0x0) {
      return 0;
    }
    if ((local_38->nodetype & LYS_CASE) == LYS_UNKNOWN) {
      return 0;
    }
LAB_0011f272:
    plVar4 = lys_parent(local_38);
    plVar5 = local_38;
    local_38 = plVar4;
  } while( true );
}

Assistant:

int
lyv_multicases(struct lyd_node *node, struct lys_node *schemanode, struct lyd_node **first_sibling,
               int autodelete, struct lyd_node *nodel)
{
    struct lys_node *sparent, *schoice, *scase, *saux;
    struct lyd_node *next, *iter;
    assert(node || schemanode);

    if (!schemanode) {
        schemanode = node->schema;
    }

    for (sparent = lys_parent(schemanode); sparent && (sparent->nodetype == LYS_USES); sparent = lys_parent(sparent));
    if (!sparent || !(sparent->nodetype & (LYS_CHOICE | LYS_CASE))) {
        /* node is not under any choice */
        return 0;
    } else if (!first_sibling || !(*first_sibling)) {
        /* nothing to check */
        return 0;
    }

    /* remember which case to skip in which choice */
    if (sparent->nodetype == LYS_CHOICE) {
        schoice = sparent;
        scase = schemanode;
    } else {
        schoice = lys_parent(sparent);
        scase = sparent;
    }

autodelete:
    /* remove all nodes from other cases than 'sparent' */
    LY_TREE_FOR_SAFE(*first_sibling, next, iter) {
        if (schemanode == iter->schema) {
            continue;
        }

        for (sparent = lys_parent(iter->schema); sparent && (sparent->nodetype == LYS_USES); sparent = lys_parent(sparent));
        if (sparent && ((sparent->nodetype == LYS_CHOICE && sparent == schoice) /* another implicit case */
                || (sparent->nodetype == LYS_CASE && sparent != scase && lys_parent(sparent) == schoice)) /* another case */
                ) {
            if (autodelete) {
                if (iter == nodel) {
                    LOGVAL(schemanode->module->ctx, LYE_MCASEDATA, LY_VLOG_LYD, iter, schoice->name);
                    return 2;
                }
                if (iter == *first_sibling) {
                    *first_sibling = next;
                }
                lyd_free(iter);
            } else {
                LOGVAL(schemanode->module->ctx, LYE_MCASEDATA, LY_VLOG_LYD, iter, schoice->name);
                return 1;
            }
        }
    }

    if (*first_sibling && (saux = lys_parent(schoice)) && (saux->nodetype & LYS_CASE)) {
        /* go recursively in case of nested choices */
        schoice = lys_parent(saux);
        scase = saux;
        goto autodelete;
    }

    return 0;
}